

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O1

void __thiscall google::CapturedStream::StopCapture(CapturedStream *this)

{
  int iVar1;
  ostream *poVar2;
  LogMessage LStack_18;
  
  if (this->uncaptured_fd_ != -1) {
    fflush((FILE *)0x0);
    iVar1 = dup2(this->uncaptured_fd_,this->fd_);
    if (iVar1 == -1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                 ,0x138);
      poVar2 = LogMessage::stream(&LStack_18);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"Check failed: dup2(uncaptured_fd_, fd_) != -1 ",0x2e);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18);
    }
  }
  return;
}

Assistant:

void StopCapture() {
    // Restore original stream
    if (uncaptured_fd_ != -1) {
      fflush(NULL);
      CHECK(dup2(uncaptured_fd_, fd_) != -1);
    }
  }